

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

DynamicProfileInfo *
Js::DynamicProfileInfo::New
          (Recycler *recycler,FunctionBody *functionBody,bool persistsAcrossScriptContexts)

{
  code *pcVar1;
  bool bVar2;
  ProfileId PVar3;
  ArgSlot AVar4;
  uint uVar5;
  Recycler *pRVar6;
  DynamicProfileInfo *pDVar7;
  undefined4 *puVar8;
  size_t local_1f8;
  ulong local_1e8;
  Type *field;
  DynamicProfileInfo *pDStack_1c8;
  uint i_1;
  BYTE *current;
  TrackAllocData local_1b0;
  code *local_188;
  undefined8 local_180;
  TrackAllocData local_178;
  code *local_150;
  undefined8 local_148;
  TrackAllocData local_140;
  DynamicProfileInfo *local_118;
  DynamicProfileInfo *info;
  uint local_108;
  uint i;
  Allocation batch [14];
  size_t totalAlloc;
  bool persistsAcrossScriptContexts_local;
  FunctionBody *functionBody_local;
  Recycler *recycler_local;
  
  batch[0xd].size = 0;
  local_108 = 8;
  PVar3 = FunctionBody::GetProfiledCallSiteCount(functionBody);
  batch[0]._0_8_ = (ulong)PVar3 << 4;
  batch[0].size._0_4_ = 0x10;
  PVar3 = FunctionBody::GetProfiledCallApplyCallSiteCount(functionBody);
  batch[1]._0_8_ = (ulong)PVar3 << 4;
  batch[1].size._0_4_ = 0x30;
  PVar3 = FunctionBody::GetProfiledLdLenCount(functionBody);
  batch[2]._0_8_ = (ulong)PVar3 << 2;
  batch[2].size._0_4_ = 0x38;
  PVar3 = FunctionBody::GetProfiledLdElemCount(functionBody);
  batch[3]._0_8_ = (ulong)PVar3 * 6;
  batch[3].size._0_4_ = 0x40;
  PVar3 = FunctionBody::GetProfiledStElemCount(functionBody);
  batch[4]._0_8_ = (ulong)PVar3 << 2;
  batch[4].size._0_4_ = 0x48;
  PVar3 = FunctionBody::GetProfiledArrayCallSiteCount(functionBody);
  batch[5]._0_8_ = (ulong)PVar3 * 0xc;
  batch[5].size._0_4_ = 0x58;
  uVar5 = FunctionBody::GetProfiledFldCount(functionBody);
  batch[6]._0_8_ = (ulong)uVar5 << 2;
  batch[6].size._0_4_ = 0x20;
  PVar3 = FunctionBody::GetProfiledDivOrRemCount(functionBody);
  batch[7]._0_8_ = (ulong)PVar3 << 1;
  batch[7].size._0_4_ = 0x28;
  PVar3 = FunctionBody::GetProfiledSwitchCount(functionBody);
  batch[8]._0_8_ = (ulong)PVar3 << 1;
  batch[8].size._0_4_ = 0x60;
  PVar3 = FunctionBody::GetProfiledSlotCount(functionBody);
  batch[9]._0_8_ = (ulong)PVar3 << 1;
  batch[9].size._0_4_ = 0x50;
  AVar4 = FunctionBody::GetProfiledInParamsCount(functionBody);
  batch[10]._0_8_ = (ulong)AVar4 << 1;
  batch[10].size._0_4_ = 0x18;
  PVar3 = FunctionBody::GetProfiledReturnTypeCount(functionBody);
  batch[0xb]._0_8_ = (ulong)PVar3 << 1;
  batch[0xb].size._0_4_ = 0x68;
  bVar2 = EnableImplicitCallFlags(functionBody);
  if (bVar2) {
    uVar5 = FunctionBody::GetLoopCount(functionBody);
    local_1e8 = (ulong)uVar5;
  }
  else {
    local_1e8 = 0;
  }
  batch[0xc]._0_8_ = local_1e8;
  batch[0xc].size._0_4_ = 0x78;
  uVar5 = FunctionBody::GetLoopCount(functionBody);
  if (uVar5 == 0) {
    local_1f8 = 0;
  }
  else {
    uVar5 = FunctionBody::GetLoopCount(functionBody);
    local_1f8 = BVFixed::GetAllocSize(uVar5 << 1);
  }
  batch[0xd]._0_8_ = local_1f8;
  for (info._4_4_ = 0; info._4_4_ < 0xe; info._4_4_ = info._4_4_ + 1) {
    batch[0xd].size = *(long *)(batch + info._4_4_) + batch[0xd].size;
  }
  local_118 = (DynamicProfileInfo *)0x0;
  if (persistsAcrossScriptContexts) {
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_140,(type_info *)&typeinfo,batch[0xd].size,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
               ,0x5e);
    pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,&local_140);
    local_150 = Memory::Recycler::AllocZero;
    local_148 = 0;
    pDVar7 = (DynamicProfileInfo *)new<Memory::Recycler>(0xa8,pRVar6,0x473830,0);
    DynamicProfileInfo(pDVar7,functionBody);
    pDVar7->persistsAcrossScriptContexts = true;
    local_118 = pDVar7;
  }
  else {
    bVar2 = NeedProfileInfoList();
    if (bVar2) {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_178,(type_info *)&typeinfo,batch[0xd].size,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                 ,0x68);
      pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,&local_178);
      local_188 = Memory::Recycler::AllocZero;
      local_180 = 0;
      pDVar7 = (DynamicProfileInfo *)new<Memory::Recycler>(0xa8,pRVar6,0x473830,0);
      DynamicProfileInfo(pDVar7,functionBody);
      local_118 = pDVar7;
    }
    else {
      Memory::TrackAllocData::CreateTrackAllocData
                (&local_1b0,(type_info *)&typeinfo,batch[0xd].size,0xffffffffffffffff,
                 "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                 ,0x6d);
      pRVar6 = Memory::Recycler::TrackAllocInfo(recycler,&local_1b0);
      pDVar7 = (DynamicProfileInfo *)new<Memory::Recycler>(0xa8,pRVar6,0x81cfb0,0);
      DynamicProfileInfo(pDVar7,functionBody);
      local_118 = pDVar7;
    }
  }
  pDStack_1c8 = local_118 + 1;
  for (field._4_4_ = 0; field._4_4_ < 0xe; field._4_4_ = field._4_4_ + 1) {
    if (*(long *)(batch + field._4_4_) != 0) {
      Memory::WriteBarrierPtr<unsigned_char>::operator=
                ((WriteBarrierPtr<unsigned_char> *)
                 ((long)&(local_118->dynamicProfileFunctionInfo).ptr +
                 (ulong)(&local_108)[(ulong)field._4_4_ * 4]),(uchar *)pDStack_1c8);
      pDStack_1c8 = (DynamicProfileInfo *)
                    ((long)&(pDStack_1c8->dynamicProfileFunctionInfo).ptr +
                    *(long *)(batch + field._4_4_));
    }
  }
  if ((long)pDStack_1c8 + (-0xa8 - (long)local_118) != batch[0xd].size) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileInfo.cpp"
                                ,0x7b,
                                "(current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc)"
                                ,
                                "current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc"
                               );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  Initialize(local_118,functionBody);
  return local_118;
}

Assistant:

DynamicProfileInfo* DynamicProfileInfo::New(Recycler* recycler, FunctionBody* functionBody, bool persistsAcrossScriptContexts)
    {
        size_t totalAlloc = 0;
        Allocation batch[] =
        {
            { (uint)offsetof(DynamicProfileInfo, callSiteInfo), functionBody->GetProfiledCallSiteCount() * sizeof(CallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, callApplyTargetInfo), functionBody->GetProfiledCallApplyCallSiteCount() * sizeof(CallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, ldLenInfo), functionBody->GetProfiledLdLenCount() * sizeof(LdLenInfo) },
            { (uint)offsetof(DynamicProfileInfo, ldElemInfo), functionBody->GetProfiledLdElemCount() * sizeof(LdElemInfo) },
            { (uint)offsetof(DynamicProfileInfo, stElemInfo), functionBody->GetProfiledStElemCount() * sizeof(StElemInfo) },
            { (uint)offsetof(DynamicProfileInfo, arrayCallSiteInfo), functionBody->GetProfiledArrayCallSiteCount() * sizeof(ArrayCallSiteInfo) },
            { (uint)offsetof(DynamicProfileInfo, fldInfo), functionBody->GetProfiledFldCount() * sizeof(FldInfo) },
            { (uint)offsetof(DynamicProfileInfo, divideTypeInfo), functionBody->GetProfiledDivOrRemCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, switchTypeInfo), functionBody->GetProfiledSwitchCount() * sizeof(ValueType)},
            { (uint)offsetof(DynamicProfileInfo, slotInfo), functionBody->GetProfiledSlotCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, parameterInfo), functionBody->GetProfiledInParamsCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, returnTypeInfo), functionBody->GetProfiledReturnTypeCount() * sizeof(ValueType) },
            { (uint)offsetof(DynamicProfileInfo, loopImplicitCallFlags), (EnableImplicitCallFlags(functionBody) ? (functionBody->GetLoopCount() * sizeof(ImplicitCallFlags)) : 0) },
            { (uint)offsetof(DynamicProfileInfo, loopFlags), functionBody->GetLoopCount() ? BVFixed::GetAllocSize(functionBody->GetLoopCount() * LoopFlags::COUNT) : 0 }
        };

        for (uint i = 0; i < _countof(batch); i++)
        {
            totalAlloc += batch[i].size;
        }

        DynamicProfileInfo* info = nullptr;

        // In the profile storage case (-only), always allocate a non-leaf profile
        // In the regular profile case, we need to allocate it as non-leaf only if it's
        // a profile being used in the in-memory cache. This is because in that case, the profile
        // also allocates dynamicProfileFunctionInfo, which it uses to match functions across
        // script contexts. In the normal case, since we don't allocate that structure, we
        // can be a leaf allocation.
        if (persistsAcrossScriptContexts)
        {
            info = RecyclerNewPlusZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
#if DBG
            info->persistsAcrossScriptContexts = true;
#endif
        }
        else
        {
#if DBG_DUMP || defined(DYNAMIC_PROFILE_STORAGE) || defined(RUNTIME_DATA_COLLECTION)
            if (DynamicProfileInfo::NeedProfileInfoList())
            {
                info = RecyclerNewPlusZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
            }
            else
#endif
            {
                info = RecyclerNewPlusLeafZ(recycler, totalAlloc, DynamicProfileInfo, functionBody);
            }
        }
        BYTE* current = (BYTE*)info + sizeof(DynamicProfileInfo);

        for (uint i = 0; i < _countof(batch); i++)
        {
            if (batch[i].size > 0)
            {
                Field(BYTE*)* field = (Field(BYTE*)*)(((BYTE*)info + batch[i].offset));
                *field = current;
                current += batch[i].size;
            }
        }
        Assert(current - reinterpret_cast<BYTE*>(info) - sizeof(DynamicProfileInfo) == totalAlloc);

        info->Initialize(functionBody);
        return info;
    }